

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

void __thiscall String::append(String *this,String *ba)

{
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)ba);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void append(const String &ba)
    {
        mString.append(ba);
    }